

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

void free_urlhandle(Curl_URL *u)

{
  (*Curl_cfree)(u->scheme);
  (*Curl_cfree)(u->user);
  (*Curl_cfree)(u->password);
  (*Curl_cfree)(u->options);
  (*Curl_cfree)(u->host);
  (*Curl_cfree)(u->port);
  (*Curl_cfree)(u->path);
  (*Curl_cfree)(u->query);
  (*Curl_cfree)(u->fragment);
  (*Curl_cfree)(u->scratch);
  return;
}

Assistant:

static void free_urlhandle(struct Curl_URL *u)
{
  free(u->scheme);
  free(u->user);
  free(u->password);
  free(u->options);
  free(u->host);
  free(u->port);
  free(u->path);
  free(u->query);
  free(u->fragment);
  free(u->scratch);
}